

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O3

void burstsort2_sampling_superalphabet_vector(uchar **strings,size_t n)

{
  iterator __position;
  TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *node;
  undefined8 *puVar1;
  TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *pTVar2;
  pointer ppvVar3;
  vector<unsigned_char*,std::allocator<unsigned_char*>> *this;
  TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *pTVar4;
  _func_void_uchar_ptr_ptr_int_int *in_RCX;
  ulong uVar5;
  ushort uVar6;
  long lVar7;
  uchar *puVar8;
  _func_void_uchar_ptr_ptr_int_int *p_Var9;
  uint uVar10;
  size_t depth;
  ulong uVar12;
  size_t sVar13;
  uchar *str;
  BurstSimple<unsigned_short> local_49;
  uchar **local_48;
  uchar *local_40;
  size_t local_38;
  ulong uVar11;
  
  local_48 = strings;
  node = (TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
          *)operator_new(0x18);
  (node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = n;
  if (n != 0) {
    lVar7 = 2000;
    uVar12 = 0;
    do {
      if (local_48[uVar12] == (uchar *)0x0) goto LAB_001abb1c;
      puVar8 = local_48[uVar12] + 1;
      pTVar2 = node;
      while ((puVar8[-1] != '\0' && (*puVar8 != '\0'))) {
        uVar10 = (uint)CONCAT11(puVar8[-1],*puVar8);
        uVar11 = (ulong)uVar10;
        ppvVar3 = (pTVar2->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar5 = (long)(pTVar2->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                      .super__Vector_impl_data._M_finish - (long)ppvVar3 >> 3;
        if (uVar5 < uVar10 + 1) {
          std::vector<void_*,_std::allocator<void_*>_>::resize
                    (&pTVar2->_buckets,(ulong)(uVar10 + 1));
          ppvVar3 = (pTVar2->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar5 = (long)(pTVar2->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppvVar3 >> 3;
        }
        if ((uVar5 <= uVar11) || (((ulong)ppvVar3[uVar11] & 1) == 0)) {
          puVar1 = (undefined8 *)operator_new(0x18);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1[2] = 0;
          *(undefined8 **)
           ((long)(pTVar2->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start + (ulong)(uVar10 * 8)) = puVar1;
          ppvVar3 = (pTVar2->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar5 = *(ulong *)((long)ppvVar3 + (ulong)(uVar10 * 8));
          if (uVar5 == 0) goto LAB_001abb5a;
          ppvVar3[uVar11] = (void *)(uVar5 | 1);
          lVar7 = lVar7 + -1;
          if (lVar7 == 0) goto LAB_001ab998;
        }
        pTVar2 = TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
                 ::get_node(pTVar2,uVar10);
        puVar8 = puVar8 + 2;
        if (pTVar2 == (TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
                       *)0x0) {
          __assert_fail("node",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                        ,0xd9,
                        "TrieNode<CharT, BucketT> *pseudo_sample(unsigned char **, size_t) [CharT = unsigned short, BucketT = std::vector<unsigned char *>]"
                       );
        }
      }
      uVar12 = uVar12 + 0x2000;
    } while (uVar12 < local_38);
LAB_001ab998:
    sVar13 = 0;
    do {
      local_40 = local_48[sVar13];
      if (local_40 == (uchar *)0x0) {
LAB_001abb1c:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (*local_40 == '\0') {
        uVar6 = 0;
      }
      else {
        uVar6 = CONCAT11(*local_40,local_40[1]);
      }
      p_Var9 = (_func_void_uchar_ptr_ptr_int_int *)(ulong)uVar6;
      uVar10 = (uint)uVar6;
      ppvVar3 = (node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      in_RCX = (_func_void_uchar_ptr_ptr_int_int *)
               ((long)(node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppvVar3 >> 3);
      depth = 2;
      pTVar2 = node;
      if (p_Var9 < in_RCX) {
        lVar7 = 0;
        do {
          if (((ulong)ppvVar3[(long)p_Var9] & 1) == 0) break;
          if ((char)uVar6 == '\0') {
            __assert_fail("not is_end(c)",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                          ,0xeb,
                          "void insert(TrieNode<CharT, BucketT> *, unsigned char **, size_t) [Threshold = 16384U, BucketT = std::vector<unsigned char *>, BurstImpl = BurstSimple<unsigned short>, CharT = unsigned short]"
                         );
          }
          pTVar2 = TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
                   ::get_node(pTVar2,(uint)p_Var9);
          if (local_40 == (uchar *)0x0) goto LAB_001abb1c;
          if (local_40[lVar7 + 2] == '\0') {
            uVar6 = 0;
          }
          else {
            uVar6 = CONCAT11(local_40[lVar7 + 2],local_40[lVar7 + 3]);
          }
          p_Var9 = (_func_void_uchar_ptr_ptr_int_int *)(ulong)uVar6;
          ppvVar3 = (pTVar2->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          in_RCX = (_func_void_uchar_ptr_ptr_int_int *)
                   ((long)(pTVar2->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)ppvVar3 >> 3);
          lVar7 = lVar7 + 2;
        } while (p_Var9 < in_RCX);
        uVar10 = (uint)p_Var9;
        depth = lVar7 + 2;
      }
      this = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)
             TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
             ::get_bucket(pTVar2,uVar10);
      if (this == (vector<unsigned_char*,std::allocator<unsigned_char*>> *)0x0) {
        __assert_fail("bucket",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                      ,0xf1,
                      "void insert(TrieNode<CharT, BucketT> *, unsigned char **, size_t) [Threshold = 16384U, BucketT = std::vector<unsigned char *>, BurstImpl = BurstSimple<unsigned short>, CharT = unsigned short]"
                     );
      }
      __position._M_current = *(uchar ***)(this + 8);
      if (__position._M_current == *(uchar ***)(this + 0x10)) {
        std::vector<unsigned_char*,std::allocator<unsigned_char*>>::
        _M_realloc_insert<unsigned_char*const&>(this,__position,&local_40);
      }
      else {
        *__position._M_current = local_40;
        *(long *)(this + 8) = *(long *)(this + 8) + 8;
      }
      if (((char)uVar6 != '\0') && (0x20000 < (ulong)(*(long *)(this + 8) - *(long *)this))) {
        pTVar4 = BurstSimple<unsigned_short>::operator()
                           (&local_49,
                            (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)this,depth)
        ;
        in_RCX = (_func_void_uchar_ptr_ptr_int_int *)(ulong)uVar6;
        *(TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
          **)((long)(pTVar2->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start + (ulong)((uint)uVar6 * 8)) = pTVar4;
        ppvVar3 = (pTVar2->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar12 = *(ulong *)((long)ppvVar3 + (ulong)((uint)uVar6 * 8));
        if (uVar12 == 0) {
LAB_001abb5a:
          __assert_fail("ptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                        ,0x5c,"void make_trie(void *&)");
        }
        ppvVar3[(long)in_RCX] = (void *)(uVar12 | 1);
        if (*(void **)this != (void *)0x0) {
          operator_delete(*(void **)this);
        }
        operator_delete(this);
      }
      sVar13 = sVar13 + 1;
    } while (sVar13 != local_38);
  }
  traverse<void(*)(unsigned_char**,int,int),std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
            (node,local_48,0,in_RCX);
  return;
}

Assistant:

void burstsort2_sampling_superalphabet_vector(unsigned char** strings, size_t n)
{
	typedef uint16_t CharT;
	typedef std::vector<unsigned char*> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	TrieNode<CharT, BucketT>* root = pseudo_sample<CharT, BucketT>(strings, n);
	insert<16384, BucketT, BurstImpl>(root, strings, n);
	traverse(root, strings, 0, SmallSort);
}